

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O3

bool embree::operator==(Ref<embree::XML> *a,Ref<embree::XML> *b)

{
  size_t __n;
  pointer pRVar1;
  Token *pTVar2;
  bool bVar3;
  int iVar4;
  XML *pXVar5;
  XML *pXVar6;
  Token *a_00;
  pointer b_00;
  pointer b_01;
  pointer a_01;
  
  pXVar6 = a->ptr;
  pXVar5 = b->ptr;
  __n = (pXVar6->name)._M_string_length;
  if (((__n == (pXVar5->name)._M_string_length) &&
      (((__n == 0 ||
        (iVar4 = bcmp((pXVar6->name)._M_dataplus._M_p,(pXVar5->name)._M_dataplus._M_p,__n),
        iVar4 == 0)) &&
       ((pXVar6->parms)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (pXVar5->parms)._M_t._M_impl.super__Rb_tree_header._M_node_count)))) &&
     (bVar3 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        ((pXVar6->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )&(pXVar6->parms)._M_t._M_impl.super__Rb_tree_header,
                         (pXVar5->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left),
     bVar3)) {
    pXVar6 = a->ptr;
    pXVar5 = b->ptr;
    a_01 = (pXVar6->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (pXVar6->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    b_00 = (pXVar5->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    if ((long)pRVar1 - (long)a_01 ==
        (long)(pXVar5->children).
              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)b_00) {
      if (a_01 != pRVar1) {
        do {
          bVar3 = operator==(a_01,b_00);
          if (!bVar3) {
            return false;
          }
          a_01 = a_01 + 1;
          b_00 = b_00 + 1;
        } while (a_01 != pRVar1);
        pXVar6 = a->ptr;
        pXVar5 = b->ptr;
      }
      a_00 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      b_01 = (pXVar5->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
      if ((long)pTVar2 - (long)a_00 ==
          (long)(pXVar5->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)b_01) {
        if (a_00 == pTVar2) {
          return true;
        }
        do {
          bVar3 = operator==(a_00,b_01);
          if (!bVar3) {
            return bVar3;
          }
          a_00 = a_00 + 1;
          b_01 = b_01 + 1;
        } while (a_00 != pTVar2);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool operator <( const Ref<XML>& a, const Ref<XML>& b ) {
      if (a->name     != b->name    ) return a->name     < b->name;
      if (a->parms    != b->parms   ) return a->parms    < b->parms;
      if (a->children != b->children) return a->children < b->children;
      if (a->body     != b->body    ) return a->body     < b->body;
      return false;
    }